

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeRef * __thiscall ExpressionContext::GetReferenceType(ExpressionContext *this,TypeBase *type)

{
  int iVar1;
  undefined4 extraout_var;
  InplaceStr name;
  TypeRef *local_20;
  TypeRef *this_00;
  
  if (type != (TypeBase *)0x0) {
    if (type->typeID - 0x1a < 3) {
      __assert_fail("!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x68a,"TypeRef *ExpressionContext::GetReferenceType(TypeBase *)");
    }
    if (type->typeID == 0) {
      __assert_fail("!isType<TypeError>(type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x68b,"TypeRef *ExpressionContext::GetReferenceType(TypeBase *)");
    }
  }
  if (this->typeAuto != type) {
    this_00 = type->refType;
    if (this_00 == (TypeRef *)0x0) {
      iVar1 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x68);
      this_00 = (TypeRef *)CONCAT44(extraout_var,iVar1);
      name = GetReferenceTypeName(this,type);
      TypeRef::TypeRef(this_00,name,type);
      type->refType = this_00;
      local_20 = this_00;
      SmallArray<TypeBase_*,_128U>::push_back(&this->types,(TypeBase **)&local_20);
    }
    return this_00;
  }
  __assert_fail("type != typeAuto",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x68e,"TypeRef *ExpressionContext::GetReferenceType(TypeBase *)");
}

Assistant:

TypeRef* ExpressionContext::GetReferenceType(TypeBase* type)
{
	// Can't derive from pseudo types
	assert(!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type));
	assert(!isType<TypeError>(type));

	// Can't create reference to auto this way
	assert(type != typeAuto);

	if(type->refType)
		return type->refType;

	// Create new type
	TypeRef* result = new (get<TypeRef>()) TypeRef(GetReferenceTypeName(*this, type), type);

	// Save it for future use
	type->refType = result;

	types.push_back(result);

	return result;
}